

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O2

void __thiscall QNetworkCacheMetaData::setSaveToDisk(QNetworkCacheMetaData *this,bool allow)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkCacheMetaDataPrivate>::operator->(&this->d);
  pQVar1->saveToDisk = allow;
  return;
}

Assistant:

void QNetworkCacheMetaData::setSaveToDisk(bool allow)
{
    d->saveToDisk = allow;
}